

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_build_lights.cxx
# Opt level: O2

void __thiscall
xray_re::xr_build_lights::read_lights
          (xr_build_lights *this,xr_reader *r,uint32_t id,r_light_vec *lights,bool cs)

{
  uint16_t *puVar1;
  float *pfVar2;
  uint32_t *puVar3;
  uint32_t uVar4;
  xr_reader *this_00;
  size_t sVar5;
  ulong __n;
  long lVar6;
  bool bVar7;
  r_light *light;
  xr_reader *s;
  xr_reader *local_38;
  
  this_00 = xr_reader::open_chunk(r,id);
  if (this_00 != (xr_reader *)0x0) {
    s = this_00;
    local_38 = r;
    sVar5 = xr_reader::size(this_00);
    __n = sVar5 / ((ulong)cs * 4 + 100);
    std::vector<xray_re::r_light_*,_std::allocator<xray_re::r_light_*>_>::reserve(lights,__n);
    while (bVar7 = __n != 0, __n = __n - 1, bVar7) {
      light = (r_light *)operator_new(0x68);
      std::vector<xray_re::r_light_*,_std::allocator<xray_re::r_light_*>_>::push_back(lights,&light)
      ;
      puVar1 = (this_00->field_2).m_p_u16;
      (this_00->field_2).m_p = (uint8_t *)(puVar1 + 1);
      light->type = *puVar1;
      puVar1 = (this_00->field_2).m_p_u16;
      (this_00->field_2).m_p = (uint8_t *)(puVar1 + 1);
      light->level = *puVar1;
      xr_reader::r_fvector3(this_00,&light->diffuse);
      this_00 = s;
      xr_reader::r_fvector3(s,&light->position);
      xr_reader::r_fvector3(this_00,&light->direction);
      pfVar2 = (float *)(this_00->field_2).m_p_u32;
      (this_00->field_2).m_p = (uint8_t *)(pfVar2 + 1);
      light->range = *pfVar2;
      pfVar2 = (float *)(this_00->field_2).m_p_u32;
      (this_00->field_2).m_p = (uint8_t *)(pfVar2 + 1);
      light->range2 = *pfVar2;
      pfVar2 = (float *)(this_00->field_2).m_p_u32;
      (this_00->field_2).m_p = (uint8_t *)(pfVar2 + 1);
      light->attenuation0 = *pfVar2;
      pfVar2 = (float *)(this_00->field_2).m_p_u32;
      (this_00->field_2).m_p = (uint8_t *)(pfVar2 + 1);
      light->attenuation1 = *pfVar2;
      pfVar2 = (float *)(this_00->field_2).m_p_u32;
      (this_00->field_2).m_p = (uint8_t *)(pfVar2 + 1);
      light->attenuation2 = *pfVar2;
      pfVar2 = (float *)(this_00->field_2).m_p_u32;
      (this_00->field_2).m_p = (uint8_t *)(pfVar2 + 1);
      light->energy = *pfVar2;
      for (lVar6 = 0x40; lVar6 != 100; lVar6 = lVar6 + 0xc) {
        xr_reader::r_fvector3(this_00,(fvector3 *)((long)light->tri + lVar6 + -0x40));
      }
      uVar4 = 0;
      if (cs) {
        puVar3 = (this_00->field_2).m_p_u32;
        (this_00->field_2).m_p = (uint8_t *)(puVar3 + 1);
        uVar4 = *puVar3;
      }
      light->unknown = uVar4;
    }
    xr_reader::close_chunk(local_38,&s);
  }
  return;
}

Assistant:

void xr_build_lights::read_lights(xr_reader& r, uint32_t id, r_light_vec& lights, bool cs)
{
	if (xr_reader* s = r.open_chunk(id)) {
		size_t n = s->size() / (cs ? R_LIGHT_SIZE_CS : R_LIGHT_SIZE_SOC);
		lights.reserve(n);
		for (; n > 0; --n) {
			r_light* light = new r_light;
			lights.push_back(light);
			light->type = s->r_u16();
			light->level = s->r_u16();
			s->r_fvector3(light->diffuse);
			s->r_fvector3(light->position);
			s->r_fvector3(light->direction);
			light->range = s->r_float();
			light->range2 = s->r_float();
			light->attenuation0 = s->r_float();
			light->attenuation1 = s->r_float();
			light->attenuation2 = s->r_float();
			light->energy = s->r_float();
			for (uint_fast32_t i = 0; i != 3; ++i)
				s->r_fvector3(light->tri[i]);
			light->unknown = cs ? s->r_u32() : 0;
		}
		r.close_chunk(s);
	}
}